

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void __thiscall cfd::core::HDWallet::HDWallet(HDWallet *this,ByteData *seed)

{
  size_t sVar1;
  CfdException *this_00;
  string local_48;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&seed->data_);
  sVar1 = ByteData::GetDataSize(seed);
  if (sVar1 != 0x10) {
    sVar1 = ByteData::GetDataSize(seed);
    if (sVar1 != 0x20) {
      sVar1 = ByteData::GetDataSize(seed);
      if (sVar1 != 0x40) {
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Seed length error.","");
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_48);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  return;
}

Assistant:

HDWallet::HDWallet(const ByteData& seed) : seed_(seed) {
  if ((seed.GetDataSize() != HDWallet::kSeed128Size) &&
      (seed.GetDataSize() != HDWallet::kSeed256Size) &&
      (seed.GetDataSize() != HDWallet::kSeed512Size)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Seed length error.");
  }
}